

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall
vkt::sr::ShaderRenderCaseInstance::ShaderRenderCaseInstance
          (ShaderRenderCaseInstance *this,Context *context)

{
  SparseContext *pSVar1;
  Allocator *pAVar2;
  allocator<char> local_22;
  allocator<char> local_21;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00c00d78;
  this->m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
  this->m_quadGridSize = 4;
  pSVar1 = createSparseContext(this);
  (this->m_sparseContext).
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = pSVar1;
  pAVar2 = getAllocator(this);
  this->m_memAlloc = pAVar2;
  tcu::Vector<float,_4>::Vector
            (&this->m_clearColor,(Vector<float,_4> *)sr::(anonymous_namespace)::DEFAULT_CLEAR_COLOR)
  ;
  this->m_isVertexCase = false;
  (this->m_userAttribTransforms).
  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_userAttribTransforms).
  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_userAttribTransforms).
  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_textures).
  super__Vector_base<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textures).
  super__Vector_base<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textures).
  super__Vector_base<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_vertexShaderName,"vert",&local_21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_fragmentShaderName,"frag",&local_22);
  *(undefined8 *)(this->m_renderSize).m_data = 0x8000000080;
  this->m_colorFormat = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_evaluator = (ShaderEvaluator *)0x0;
  this->m_uniformSetup = (UniformSetup *)0x0;
  this->m_attribFunc = (AttributeSetupFunc)0x0;
  (this->m_quadGrid).super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>.
  m_data.ptr = (QuadGrid *)0x0;
  tcu::TextureLevel::TextureLevel(&this->m_resultImage);
  (this->m_descriptorPoolBuilder).
  super_UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>.m_data
  .ptr = (DescriptorPoolBuilder *)0x0;
  (this->m_descriptorSetUpdateBuilder).
  super_UniqueBase<vk::DescriptorSetUpdateBuilder,_de::DefaultDeleter<vk::DescriptorSetUpdateBuilder>_>
  .m_data.ptr = (DescriptorSetUpdateBuilder *)0x0;
  (this->m_enabledBaseAttributes).
  super__Vector_base<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute,_std::allocator<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_enabledBaseAttributes).
  super__Vector_base<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute,_std::allocator<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_enabledBaseAttributes).
  super__Vector_base<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute,_std::allocator<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_descriptorSetLayoutBuilder).
  super_UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
  .m_data.ptr = (DescriptorSetLayoutBuilder *)0x0;
  memset(&this->m_uniformInfos,0,0x90);
  this->m_sampleCount = VK_SAMPLE_COUNT_1_BIT;
  (this->m_pushConstantRanges).
  super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pushConstantRanges).
  super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_pushConstantRanges).
  super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ShaderRenderCaseInstance::ShaderRenderCaseInstance (Context& context)
	: vkt::TestInstance		(context)
	, m_imageBackingMode	(IMAGE_BACKING_MODE_REGULAR)
	, m_quadGridSize		(static_cast<deUint32>(GRID_SIZE_DEFAULT_FRAGMENT))
	, m_sparseContext		(createSparseContext())
	, m_memAlloc			(getAllocator())
	, m_clearColor			(DEFAULT_CLEAR_COLOR)
	, m_isVertexCase		(false)
	, m_vertexShaderName	("vert")
	, m_fragmentShaderName	("frag")
	, m_renderSize			(MAX_RENDER_WIDTH, MAX_RENDER_HEIGHT)
	, m_colorFormat			(VK_FORMAT_R8G8B8A8_UNORM)
	, m_evaluator			(DE_NULL)
	, m_uniformSetup		(DE_NULL)
	, m_attribFunc			(DE_NULL)
	, m_sampleCount			(VK_SAMPLE_COUNT_1_BIT)
{
}